

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O2

unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
 __thiscall Clique::getAllAlignments(Clique *this)

{
  vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>> *this_00;
  size_type pos;
  long in_RSI;
  AlignmentRecord *local_30;
  
  this_00 = (vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>> *)
            operator_new(0x18);
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  this->_vptr_Clique = (_func_int **)this_00;
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                  (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                    (in_RSI + 0x20));
  for (; pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                        (in_RSI + 0x20),pos)) {
    local_30 = (AlignmentRecord *)
               (**(code **)(**(long **)(in_RSI + 0x28) + 0x28))(*(long **)(in_RSI + 0x28),pos);
    std::vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>>::
    emplace_back<AlignmentRecord_const*>(this_00,&local_30);
  }
  return (__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<const AlignmentRecord*> > Clique::getAllAlignments() const {
	unique_ptr<vector<const AlignmentRecord*> > result(new vector<const AlignmentRecord*>());
	for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
		result->push_back(&parent.getAlignmentByIndex(i));
	}
	return result;
}